

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void ConvertBGRAToRGB565_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t *in_RDX;
  int in_ESI;
  uint32_t *in_RDI;
  ulong uVar3;
  ulong uVar5;
  undefined1 auVar4 [16];
  __m128i rgba;
  __m128i gb1;
  __m128i b1;
  __m128i rg1;
  __m128i b0;
  __m128i g_hi2;
  __m128i g_hi1;
  __m128i g_lo2;
  __m128i g_lo1;
  __m128i rb1;
  __m128i rb0;
  __m128i ga0;
  __m128i v2h;
  __m128i v2l;
  __m128i v1h;
  __m128i v1l;
  __m128i v0h;
  __m128i v0l;
  __m128i bgra4;
  __m128i bgra0;
  __m128i *out;
  __m128i *in;
  __m128i mask_0x07;
  __m128i mask_0xf8;
  __m128i mask_0xe0;
  ulong local_408;
  undefined8 local_3b8;
  uint8_t *local_328;
  uint32_t *local_320;
  int local_2d4;
  undefined1 local_2c8;
  undefined1 uStack_2c7;
  undefined1 uStack_2c6;
  undefined1 uStack_2c5;
  undefined1 uStack_2c4;
  undefined1 uStack_2c3;
  undefined1 uStack_2c2;
  undefined1 uStack_2c1;
  undefined1 local_2b8;
  undefined1 uStack_2b7;
  undefined1 uStack_2b6;
  undefined1 uStack_2b5;
  undefined1 uStack_2b4;
  undefined1 uStack_2b3;
  undefined1 uStack_2b2;
  undefined1 uStack_2b1;
  undefined1 local_268;
  undefined1 uStack_267;
  undefined1 uStack_265;
  undefined1 uStack_264;
  undefined1 uStack_263;
  undefined1 uStack_261;
  undefined1 local_258;
  undefined1 uStack_254;
  ushort local_238;
  ushort uStack_236;
  ushort uStack_234;
  ushort uStack_232;
  ushort local_218;
  ushort uStack_216;
  ushort uStack_214;
  ushort uStack_212;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_79;
  undefined1 uStack_70;
  undefined1 uStack_6c;
  undefined4 uStack_40;
  undefined4 uStack_30;
  
  local_328 = in_RDX;
  local_320 = in_RDI;
  for (local_2d4 = in_ESI; 7 < local_2d4; local_2d4 = local_2d4 + -8) {
    uVar1 = *(undefined8 *)(local_320 + 4);
    uVar2 = *(undefined8 *)(local_320 + 6);
    local_258 = (undefined1)*(undefined8 *)local_320;
    uStack_254 = (undefined1)((ulong)*(undefined8 *)local_320 >> 0x20);
    local_268 = (undefined1)uVar1;
    uStack_267 = (undefined1)((ulong)uVar1 >> 8);
    uStack_265 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_264 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_263 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_261 = (undefined1)((ulong)uVar1 >> 0x38);
    uStack_70 = (undefined1)*(undefined8 *)(local_320 + 2);
    uStack_6c = (undefined1)((ulong)*(undefined8 *)(local_320 + 2) >> 0x20);
    uStack_80 = (undefined1)uVar2;
    uStack_7f = (undefined1)((ulong)uVar2 >> 8);
    uStack_7d = (undefined1)((ulong)uVar2 >> 0x18);
    uStack_7c = (undefined1)((ulong)uVar2 >> 0x20);
    uStack_7b = (undefined1)((ulong)uVar2 >> 0x28);
    uStack_79 = (undefined1)((ulong)uVar2 >> 0x38);
    auVar4[0xd] = uStack_263;
    auVar4[0xc] = uStack_267;
    auVar4[0xe] = uStack_7f;
    auVar4[0xf] = uStack_7b;
    uVar5 = CONCAT17(uStack_7c,
                     CONCAT16(uStack_80,
                              CONCAT15(uStack_264,
                                       CONCAT14(local_268,
                                                CONCAT13(uStack_6c,
                                                         CONCAT12(uStack_70,
                                                                  CONCAT11(uStack_254,local_258)))))
                             )) & 0xf8f8f8f8f8f8f8f8;
    local_218 = (ushort)local_3b8;
    uStack_216 = (ushort)((ulong)local_3b8 >> 0x10);
    uStack_214 = (ushort)((ulong)local_3b8 >> 0x20);
    auVar4._8_4_ = uStack_30;
    auVar4._0_8_ = local_3b8;
    auVar4 = psllw(auVar4,ZEXT416(3));
    local_408 = auVar4._0_8_;
    uVar3 = CONCAT17(uStack_79,
                     CONCAT16(uStack_7d,CONCAT15(uStack_261,CONCAT14(uStack_265,uStack_40)))) &
            0xf8f8f8f8f8f8f8f8 |
            CONCAT26((ushort)((ulong)local_3b8 >> 0x35),
                     CONCAT24(uStack_214 >> 5,CONCAT22(uStack_216 >> 5,local_218 >> 5))) &
            0x707070707070707;
    local_238 = (ushort)uVar5;
    uStack_236 = (ushort)(uVar5 >> 0x10);
    uStack_234 = (ushort)(uVar5 >> 0x20);
    uVar5 = CONCAT26((ushort)(uVar5 >> 0x33),
                     CONCAT24(uStack_234 >> 3,CONCAT22(uStack_236 >> 3,local_238 >> 3))) |
            local_408 & 0xe0e0e0e0e0e0e0e0;
    local_2b8 = (undefined1)uVar3;
    uStack_2b7 = (undefined1)(uVar3 >> 8);
    uStack_2b6 = (undefined1)(uVar3 >> 0x10);
    uStack_2b5 = (undefined1)(uVar3 >> 0x18);
    uStack_2b4 = (undefined1)(uVar3 >> 0x20);
    uStack_2b3 = (undefined1)(uVar3 >> 0x28);
    uStack_2b2 = (undefined1)(uVar3 >> 0x30);
    uStack_2b1 = (undefined1)(uVar3 >> 0x38);
    local_2c8 = (undefined1)uVar5;
    uStack_2c7 = (undefined1)(uVar5 >> 8);
    uStack_2c6 = (undefined1)(uVar5 >> 0x10);
    uStack_2c5 = (undefined1)(uVar5 >> 0x18);
    uStack_2c4 = (undefined1)(uVar5 >> 0x20);
    uStack_2c3 = (undefined1)(uVar5 >> 0x28);
    uStack_2c2 = (undefined1)(uVar5 >> 0x30);
    uStack_2c1 = (undefined1)(uVar5 >> 0x38);
    *(ulong *)local_328 =
         CONCAT17(uStack_2c5,
                  CONCAT16(uStack_2b5,
                           CONCAT15(uStack_2c6,
                                    CONCAT14(uStack_2b6,
                                             CONCAT13(uStack_2c7,
                                                      CONCAT12(uStack_2b7,
                                                               CONCAT11(local_2c8,local_2b8)))))));
    *(ulong *)(local_328 + 8) =
         CONCAT17(uStack_2c1,
                  CONCAT16(uStack_2b1,
                           CONCAT15(uStack_2c2,
                                    CONCAT14(uStack_2b2,
                                             CONCAT13(uStack_2c3,
                                                      CONCAT12(uStack_2b3,
                                                               CONCAT11(uStack_2c4,uStack_2b4)))))))
    ;
    local_328 = local_328 + 0x10;
    local_320 = local_320 + 8;
  }
  if (0 < local_2d4) {
    VP8LConvertBGRAToRGB565_C(local_320,local_2d4,local_328);
  }
  return;
}

Assistant:

static void ConvertBGRAToRGB565_SSE2(const uint32_t* src,
                                     int num_pixels, uint8_t* dst) {
  const __m128i mask_0xe0 = _mm_set1_epi8(0xe0);
  const __m128i mask_0xf8 = _mm_set1_epi8(0xf8);
  const __m128i mask_0x07 = _mm_set1_epi8(0x07);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i bgra0 = _mm_loadu_si128(in++);     // bgra0|bgra1|bgra2|bgra3
    const __m128i bgra4 = _mm_loadu_si128(in++);     // bgra4|bgra5|bgra6|bgra7
    const __m128i v0l = _mm_unpacklo_epi8(bgra0, bgra4);  // b0b4g0g4r0r4a0a4...
    const __m128i v0h = _mm_unpackhi_epi8(bgra0, bgra4);  // b2b6g2g6r2r6a2a6...
    const __m128i v1l = _mm_unpacklo_epi8(v0l, v0h);      // b0b2b4b6g0g2g4g6...
    const __m128i v1h = _mm_unpackhi_epi8(v0l, v0h);      // b1b3b5b7g1g3g5g7...
    const __m128i v2l = _mm_unpacklo_epi8(v1l, v1h);      // b0...b7 | g0...g7
    const __m128i v2h = _mm_unpackhi_epi8(v1l, v1h);      // r0...r7 | a0...a7
    const __m128i ga0 = _mm_unpackhi_epi64(v2l, v2h);     // g0...g7 | a0...a7
    const __m128i rb0 = _mm_unpacklo_epi64(v2h, v2l);     // r0...r7 | b0...b7
    const __m128i rb1 = _mm_and_si128(rb0, mask_0xf8);    // -r0..-r7|-b0..-b7
    const __m128i g_lo1 = _mm_srli_epi16(ga0, 5);
    const __m128i g_lo2 = _mm_and_si128(g_lo1, mask_0x07);  // g0-...g7-|xx (3b)
    const __m128i g_hi1 = _mm_slli_epi16(ga0, 3);
    const __m128i g_hi2 = _mm_and_si128(g_hi1, mask_0xe0);  // -g0...-g7|xx (3b)
    const __m128i b0 = _mm_srli_si128(rb1, 8);              // -b0...-b7|0
    const __m128i rg1 = _mm_or_si128(rb1, g_lo2);           // gr0...gr7|xx
    const __m128i b1 = _mm_srli_epi16(b0, 3);
    const __m128i gb1 = _mm_or_si128(b1, g_hi2);            // bg0...bg7|xx
#if (WEBP_SWAP_16BIT_CSP == 1)
    const __m128i rgba = _mm_unpacklo_epi8(gb1, rg1);     // rggb0...rggb7
#else
    const __m128i rgba = _mm_unpacklo_epi8(rg1, gb1);     // bgrb0...bgrb7
#endif
    _mm_storeu_si128(out++, rgba);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGB565_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}